

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

int Gia_MuxDeref_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsMuxId(p,iObj);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    pObj_00 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjRefDec(p,pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninId0p(p,pObj_00);
      iVar1 = Gia_MuxDeref_rec(p,iVar1);
      iVar2 = Gia_ObjFaninId1p(p,pObj_00);
      iVar2 = Gia_MuxDeref_rec(p,iVar2);
      iVar3 = Gia_ObjFaninId2p(p,pObj_00);
      iVar3 = Gia_MuxDeref_rec(p,iVar3);
      p_local._4_4_ = iVar1 + iVar2 + iVar3 + 1;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_MuxDeref_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( !Gia_ObjIsMuxId(p, iObj) )
        return 0;
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjRefDec(p, pObj) )
        return 0;
    return Gia_MuxDeref_rec( p, Gia_ObjFaninId0p(p, pObj) ) + 
           Gia_MuxDeref_rec( p, Gia_ObjFaninId1p(p, pObj) ) + 
           Gia_MuxDeref_rec( p, Gia_ObjFaninId2p(p, pObj) ) + 1;
}